

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.h
# Opt level: O1

pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>_>,_bool>
 __thiscall
FlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::insert(FlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *this,value_type *value)

{
  int iVar1;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>_>
  __position;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>_>,_bool>
  pVar3;
  
  __position = std::
               __lower_bound<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,float>*,std::vector<std::pair<std::__cxx11::string,float>,std::allocator<std::pair<std::__cxx11::string,float>>>>,std::__cxx11::string,__gnu_cxx::__ops::_Iter_comp_val<FlatMap<std::__cxx11::string,float,std::less<std::__cxx11::string>>::ValueToKeyComparator>>
                         ((this->vec_).
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->vec_).
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,value);
  if (__position._M_current !=
      (this->vec_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar1 = std::__cxx11::string::compare((string *)value);
    if (-1 < iVar1) {
      uVar2 = 0;
      goto LAB_00191bd3;
    }
  }
  __position._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>
        *)std::
          vector<std::pair<std::__cxx11::string,float>,std::allocator<std::pair<std::__cxx11::string,float>>>
          ::_M_emplace_aux<std::pair<std::__cxx11::string,float>const&>
                    ((vector<std::pair<std::__cxx11::string,float>,std::allocator<std::pair<std::__cxx11::string,float>>>
                      *)this,__position._M_current,value);
  uVar2 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
LAB_00191bd3:
  pVar3._8_8_ = uVar2;
  pVar3.first._M_current = __position._M_current;
  return pVar3;
}

Assistant:

std::pair<iterator, bool> insert(const value_type& value) {
        //std::cout << "FlatMap::insert({" << value.first << ", " << value.second << "})\n";
        auto pos = std::lower_bound(vec_.begin(), vec_.end(), value.first, valueToKeyComp_);
        //std::cout << "lower_bound found at " << pos - vec_.begin() << "\n";
        if (pos == vec_.end() || comp_(value.first, pos->first)) {
            //std::cout << "new element added\n";
            return {vec_.emplace(pos, value), true};
        } else {
            //std::cout << "duplicate detected.\n";
            return {pos, false};
        }
    }